

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPDepobjUpdateClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPDepobjUpdateClause *this)

{
  string clause_string;
  allocator<char> local_31;
  allocator<char> local_30 [8];
  ulong local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"update ",local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"(",&local_31);
  if (this->type < OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_unknown) {
    std::__cxx11::string::append((char *)local_30);
  }
  std::__cxx11::string::append((char *)local_30);
  if (3 < local_28) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDepobjUpdateClause::toString() {

    std::string result = "update ";
    std::string clause_string = "(";
    OpenMPDepobjUpdateClauseDependeceType type = this->getType();
    switch (type) {
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_source:
            clause_string += "source";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_in:
            clause_string += "in";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_out:
            clause_string += "out";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_inout:
            clause_string += "inout";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_mutexinoutset:
            clause_string += "mutexinoutset";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_depobj:
            clause_string += "depobj";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_sink:
            clause_string += "sink";
            break;
        default:
            ;
    }
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}